

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

void __thiscall Fl_Tree_Item::Fl_Tree_Item(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  Fl_Tree_Item_Array::Fl_Tree_Item_Array(&this->_children,10);
  this->_label = (char *)0x0;
  this->_labelfont = prefs->_labelfont;
  this->_labelsize = prefs->_labelsize;
  this->_labelfgcolor = prefs->_labelfgcolor;
  this->_labelbgcolor = prefs->_labelbgcolor;
  this->_widget = (Fl_Widget *)0x0;
  this->_usericon = (Fl_Image *)0x0;
  this->_open = '\x01';
  this->_visible = '\x01';
  this->_active = '\x01';
  *(undefined8 *)&this->_selected = 0;
  *(undefined8 *)((long)this->_xywh + 7) = 0;
  *(undefined8 *)((long)this->_xywh + 0xf) = 0;
  *(undefined8 *)((long)this->_collapse_xywh + 7) = 0;
  *(undefined8 *)((long)this->_collapse_xywh + 0xf) = 0;
  *(undefined8 *)((long)this->_label_xywh + 7) = 0;
  *(undefined1 *)((long)this->_label_xywh + 0xf) = 0;
  this->_parent = (Fl_Tree_Item *)0x0;
  this->_userdata = (void *)0x0;
  return;
}

Assistant:

Fl_Tree_Item::Fl_Tree_Item(const Fl_Tree_Prefs &prefs) {
  _Init(prefs, 0);
}